

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_read_stream.hpp
# Opt level: O0

size_type __thiscall
io::buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_>::fill
          (buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_> *this,
          error_code *ec)

{
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  size_type sVar4;
  mutable_buffer local_70;
  mutable_buffer local_60;
  mutable_buffer local_50 [2];
  size_type local_30;
  size_type prev_size;
  buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  resize_guard;
  error_code *ec_local;
  buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_> *this_local;
  
  resize_guard.old_size_ = (size_t)ec;
  detail::buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  ::buffer_resize_guard
            ((buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
              *)&prev_size,&this->storage_);
  local_30 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::size(&this->storage_);
  sVar1 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::capacity(&this->storage_)
  ;
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize(&this->storage_,sVar1);
  sVar1 = local_30;
  local_70 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::data(&this->storage_);
  local_60 = net::operator+(&local_70,local_30);
  sVar2 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::size(&this->storage_);
  local_50[0] = net::buffer(&local_60,sVar2 + local_30);
  sVar3 = posix::file::read_some(&this->base_,local_50,(error_code *)resize_guard.old_size_);
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize
            (&this->storage_,sVar1 + sVar3);
  detail::buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  ::commit((buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
            *)&prev_size);
  sVar1 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::size(&this->storage_);
  sVar4 = sVar1 - local_30;
  detail::buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  ::~buffer_resize_guard
            ((buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
              *)&prev_size);
  return sVar4;
}

Assistant:

size_type fill(std::error_code& ec)
    {
        detail::buffer_resize_guard<buffer_type> resize_guard(storage_);
        auto prev_size = storage_.size();
        storage_.resize(storage_.capacity()); // ?
        storage_.resize(prev_size +
                base_.read_some(io::buffer(
                storage_.data() + prev_size,
                storage_.size() + prev_size),
                                ec
        ));
        resize_guard.commit();
        return storage_.size() - prev_size;
    }